

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_group
          (string *__return_storage_ptr__,Formatter *this,string *group,bool is_positional,
          vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *opts)

{
  bool bVar1;
  ostream *poVar2;
  reference ppOVar3;
  string local_208 [32];
  Option *local_1e8;
  Option *opt;
  iterator __end1;
  iterator __begin1;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range1;
  stringstream local_1b8 [8];
  stringstream out;
  ostream local_1a8 [376];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *local_30;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *opts_local;
  string *psStack_20;
  bool is_positional_local;
  string *group_local;
  Formatter *this_local;
  
  local_30 = opts;
  opts_local._7_1_ = is_positional;
  psStack_20 = group;
  group_local = (string *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = ::std::operator<<(local_1a8,"\n");
  poVar2 = ::std::operator<<(poVar2,(string *)group);
  ::std::operator<<(poVar2,":\n");
  __end1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin(opts);
  opt = (Option *)std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end(opts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                *)&opt);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
              ::operator*(&__end1);
    local_1e8 = *ppOVar3;
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xb])
              (local_208,this,local_1e8,(ulong)(opts_local._7_1_ & 1));
    ::std::operator<<(local_1a8,local_208);
    ::std::__cxx11::string::~string(local_208);
    __gnu_cxx::
    __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
    ::operator++(&__end1);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
Formatter::make_group(std::string group, bool is_positional, std::vector<const Option *> opts) const {
    std::stringstream out;

    out << "\n" << group << ":\n";
    for(const Option *opt : opts) {
        out << make_option(opt, is_positional);
    }

    return out.str();
}